

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ContactAngle2.cpp
# Opt level: O1

void __thiscall OpenMD::ContactAngle2::doFrame(ContactAngle2 *this,int param_1)

{
  SelectionManager *this_00;
  undefined8 *puVar1;
  pointer pdVar2;
  double *pdVar3;
  double *pdVar4;
  double *pdVar5;
  double *pdVar6;
  iterator __position;
  int iVar7;
  uint i_1;
  StuntDouble *pSVar8;
  pointer pVVar9;
  undefined4 uVar10;
  ulong uVar11;
  pointer extraout_RDX;
  ulong uVar12;
  long lVar13;
  pointer pvVar14;
  byte bVar15;
  ulong uVar16;
  ulong uVar17;
  int iVar18;
  long lVar19;
  bool bVar20;
  int iVar21;
  double tmp;
  double dVar22;
  uint uVar27;
  double dVar23;
  undefined1 auVar24 [16];
  undefined1 auVar25 [16];
  undefined1 auVar26 [16];
  undefined1 auVar28 [16];
  RealType RVar29;
  double dVar30;
  pointer pdVar31;
  double dVar32;
  undefined8 uVar33;
  vector<OpenMD::Vector<double,_2U>,_std::allocator<OpenMD::Vector<double,_2U>_>_> points;
  vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
  histo;
  int i;
  DynamicRectMatrix<double> mat;
  Vector<double,_2U> diff;
  DynamicVector<double,_std::allocator<double>_> evals;
  DynamicVector<double,_std::allocator<double>_> evector;
  DynamicRectMatrix<double> evects;
  Eigenvalue<double> eigensystem;
  RealType coeff [3];
  Mat3x3d hmat;
  double local_238;
  double dStack_230;
  vector<OpenMD::Vector<double,_2U>,_std::allocator<OpenMD::Vector<double,_2U>_>_> local_228;
  pointer local_208;
  double dStack_200;
  vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
  local_1f8;
  int local_1dc;
  undefined1 local_1d8 [16];
  DynamicRectMatrix<double> local_1c8;
  RealType local_1b8;
  double dStack_1b0;
  double local_1a8 [2];
  vector<double,_std::allocator<double>_> local_198;
  DynamicVector<double,_std::allocator<double>_> local_180;
  DynamicRectMatrix<double> local_168;
  double local_158;
  double dStack_150;
  RealType local_148 [4];
  Eigenvalue<double> local_128;
  double local_a8;
  undefined8 uStack_a0;
  double local_98 [4];
  Mat3x3d local_78;
  
  Snapshot::getHmat(&local_78,((this->super_SequentialAnalyzer).info_)->sman_->currentSnapshot_);
  local_1d8._8_8_ = 0;
  local_1d8._0_8_ =
       local_78.super_SquareMatrix<double,_3>.super_RectMatrix<double,_3U,_3U>.data_[2][2];
  dVar22 = local_78.super_SquareMatrix<double,_3>.super_RectMatrix<double,_3U,_3U>.data_[1][1];
  if (local_78.super_SquareMatrix<double,_3>.super_RectMatrix<double,_3U,_3U>.data_[0][0] <=
      local_78.super_SquareMatrix<double,_3>.super_RectMatrix<double,_3U,_3U>.data_[1][1]) {
    dVar22 = local_78.super_SquareMatrix<double,_3>.super_RectMatrix<double,_3U,_3U>.data_[0][0];
  }
  local_208 = (pointer)this->nRBins_;
  dStack_200 = (double)this->nZBins_;
  local_1f8.
  super__Vector_base<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_1f8.
  super__Vector_base<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_1f8.
  super__Vector_base<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  std::
  vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
  ::resize(&local_1f8,this->nRBins_);
  if (local_1f8.
      super__Vector_base<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
      ._M_impl.super__Vector_impl_data._M_finish !=
      local_1f8.
      super__Vector_base<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
      ._M_impl.super__Vector_impl_data._M_start) {
    uVar11 = 0;
    uVar12 = 1;
    do {
      std::vector<double,_std::allocator<double>_>::resize
                (local_1f8.
                 super__Vector_base<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
                 ._M_impl.super__Vector_impl_data._M_start + uVar11,this->nZBins_);
      pdVar31 = local_1f8.
                super__Vector_base<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
                ._M_impl.super__Vector_impl_data._M_start[uVar11].
                super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
                _M_start;
      pdVar2 = local_1f8.
               super__Vector_base<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
               ._M_impl.super__Vector_impl_data._M_start[uVar11].
               super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
               _M_finish;
      if (pdVar31 != pdVar2) {
        memset(pdVar31,0,((long)pdVar2 + (-8 - (long)pdVar31) & 0xfffffffffffffff8U) + 8);
      }
      uVar11 = ((long)local_1f8.
                      super__Vector_base<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
                      ._M_impl.super__Vector_impl_data._M_finish -
                (long)local_1f8.
                      super__Vector_base<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
                      ._M_impl.super__Vector_impl_data._M_start >> 3) * -0x5555555555555555;
      bVar20 = uVar12 <= uVar11;
      lVar19 = uVar11 - uVar12;
      uVar11 = uVar12;
      uVar12 = (ulong)((int)uVar12 + 1);
    } while (bVar20 && lVar19 != 0);
  }
  if ((this->super_SequentialAnalyzer).evaluator1_.isDynamic_ != false) {
    SelectionEvaluator::evaluate
              ((SelectionSet *)&local_128,&(this->super_SequentialAnalyzer).evaluator1_);
    lVar19 = 0;
    do {
      std::vector<bool,_std::allocator<bool>_>::operator=
                ((vector<bool,_std::allocator<bool>_> *)
                 ((long)&(((this->super_SequentialAnalyzer).seleMan1_.ss_.bitsets_.
                           super__Vector_base<OpenMD::OpenMDBitSet,_std::allocator<OpenMD::OpenMDBitSet>_>
                           ._M_impl.super__Vector_impl_data._M_start)->bitset_).
                         super__Bvector_base<std::allocator<bool>_> + lVar19),
                 (vector<bool,_std::allocator<bool>_> *)(local_128._0_8_ + lVar19));
      lVar19 = lVar19 + 0x28;
    } while (lVar19 != 0xf0);
    std::vector<OpenMD::OpenMDBitSet,_std::allocator<OpenMD::OpenMDBitSet>_>::~vector
              ((vector<OpenMD::OpenMDBitSet,_std::allocator<OpenMD::OpenMDBitSet>_> *)&local_128);
  }
  local_1b8 = this->solidZ_;
  local_148[0] = this->centroidX_;
  local_148[1] = this->centroidY_;
  this_00 = &(this->super_SequentialAnalyzer).seleMan1_;
  local_148[2] = local_1b8;
  pSVar8 = SelectionManager::beginSelected(this_00,&local_1dc);
  auVar26._0_8_ =
       ((double)((ulong)local_208 >> 0x20 | 0x4530000000000000) - 1.9342813118337666e+25) +
       (double)((ulong)local_208 & 0xffffffff | 0x4330000000000000);
  auVar26._8_8_ =
       ((double)((ulong)dStack_200 >> 0x20 | 0x4530000000000000) - 1.9342813118337666e+25) +
       (double)((ulong)dStack_200 & 0xffffffff | 0x4330000000000000);
  auVar24._8_8_ = local_1d8._0_8_;
  auVar24._0_8_ = dVar22;
  auVar24 = divpd(auVar24,auVar26);
  local_1d8._0_8_ = (double)local_1d8._0_8_ * 0.5;
  while (pSVar8 != (StuntDouble *)0x0) {
    lVar19 = *(long *)((long)&(pSVar8->snapshotMan_->currentSnapshot_->atomData).position.
                              super__Vector_base<OpenMD::Vector3<double>,_std::allocator<OpenMD::Vector3<double>_>_>
                              ._M_impl.super__Vector_impl_data._M_start + pSVar8->storage_);
    pVVar9 = *(pointer *)(lVar19 + 0x10 + (long)pSVar8->localIndex_ * 0x18);
    local_228.
    super__Vector_base<OpenMD::Vector<double,_2U>,_std::allocator<OpenMD::Vector<double,_2U>_>_>.
    _M_impl.super__Vector_impl_data._M_end_of_storage = pVVar9;
    puVar1 = (undefined8 *)(lVar19 + (long)pSVar8->localIndex_ * 0x18);
    local_228.
    super__Vector_base<OpenMD::Vector<double,_2U>,_std::allocator<OpenMD::Vector<double,_2U>_>_>.
    _M_impl.super__Vector_impl_data._M_start = (pointer)*puVar1;
    local_228.
    super__Vector_base<OpenMD::Vector<double,_2U>,_std::allocator<OpenMD::Vector<double,_2U>_>_>.
    _M_impl.super__Vector_impl_data._M_finish = (pointer)puVar1[1];
    local_128._0_16_ = ZEXT816(0);
    local_128.d.data_.super__Vector_base<double,_std::allocator<double>_>._M_impl.
    super__Vector_impl_data._M_finish = (pointer)0x0;
    lVar19 = 0;
    do {
      *(double *)(&local_128.n + lVar19 * 2) =
           (double)(&local_228.
                     super__Vector_base<OpenMD::Vector<double,_2U>,_std::allocator<OpenMD::Vector<double,_2U>_>_>
                     ._M_impl.super__Vector_impl_data._M_start)[lVar19] - local_148[lVar19];
      lVar19 = lVar19 + 1;
    } while (lVar19 != 3);
    dVar22 = (double)local_128.d.data_.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                     super__Vector_impl_data._M_start *
             (double)local_128.d.data_.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                     super__Vector_impl_data._M_start +
             (double)local_128._0_8_ * (double)local_128._0_8_;
    if (dVar22 < 0.0) {
      local_208 = local_128.d.data_.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                  super__Vector_impl_data._M_finish;
      dStack_200 = 0.0;
      dVar22 = sqrt(dVar22);
      pVVar9 = extraout_RDX;
      pdVar31 = local_208;
    }
    else {
      dVar22 = SQRT(dVar22);
      pdVar31 = local_128.d.data_.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                super__Vector_impl_data._M_finish;
    }
    auVar25._8_8_ = (double)pdVar31 + (double)local_1d8._0_8_;
    auVar25._0_8_ = dVar22;
    auVar26 = divpd(auVar25,auVar24);
    iVar21 = (int)auVar26._0_8_;
    uVar27 = (uint)auVar26._8_8_;
    iVar18 = (int)this->nRBins_;
    iVar7 = (int)this->nZBins_;
    auVar28._0_4_ = -(uint)(iVar21 < iVar18);
    auVar28._4_4_ = -(uint)(iVar21 < iVar18);
    auVar28._8_4_ = -(uint)((int)uVar27 < iVar7);
    auVar28._12_4_ = -(uint)((int)uVar27 < iVar7);
    uVar10 = movmskpd((int)pVVar9,auVar28);
    if ((byte)(-1 < (int)uVar27 & (byte)uVar10 & (byte)uVar10 >> 1) == 1) {
      pdVar31 = local_1f8.
                super__Vector_base<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
                ._M_impl.super__Vector_impl_data._M_start[iVar21].
                super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
                _M_start;
      pdVar31[uVar27] = pSVar8->mass_ + pdVar31[uVar27];
    }
    pSVar8 = SelectionManager::nextSelected(this_00,&local_1dc);
  }
  dStack_230 = auVar24._8_8_;
  local_208 = (pointer)dStack_230;
  dStack_200 = dStack_230;
  local_238 = auVar24._0_8_;
  if ((long)local_1f8.
            super__Vector_base<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
            ._M_impl.super__Vector_impl_data._M_finish -
      (long)local_1f8.
            super__Vector_base<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
            ._M_impl.super__Vector_impl_data._M_start != 0) {
    uVar11 = ((long)local_1f8.
                    super__Vector_base<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
                    ._M_impl.super__Vector_impl_data._M_finish -
              (long)local_1f8.
                    super__Vector_base<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
                    ._M_impl.super__Vector_impl_data._M_start >> 3) * -0x5555555555555555;
    uVar12 = 0;
    do {
      pdVar31 = local_1f8.
                super__Vector_base<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
                ._M_impl.super__Vector_impl_data._M_start[uVar12].
                super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
                _M_start;
      lVar19 = (long)local_1f8.
                     super__Vector_base<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
                     ._M_impl.super__Vector_impl_data._M_start[uVar12].
                     super__Vector_base<double,_std::allocator<double>_>._M_impl.
                     super__Vector_impl_data._M_finish - (long)pdVar31;
      if (lVar19 != 0) {
        dVar22 = (double)(uVar12 & 0xffffffff) * local_238;
        uVar16 = 0;
        do {
          pdVar31[uVar16] =
               pdVar31[uVar16] *
               (1.66053886 /
               (((local_238 + dVar22) * (local_238 + dVar22) - dVar22 * dVar22) *
               dStack_230 * 3.141592653589793));
          uVar16 = uVar16 + 1;
        } while ((uVar16 & 0xffffffff) < (ulong)(lVar19 >> 3));
      }
      uVar12 = uVar12 + 1;
    } while ((uVar12 & 0xffffffff) <= uVar11 && uVar11 - (uVar12 & 0xffffffff) != 0);
  }
  local_228.
  super__Vector_base<OpenMD::Vector<double,_2U>,_std::allocator<OpenMD::Vector<double,_2U>_>_>.
  _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_228.
  super__Vector_base<OpenMD::Vector<double,_2U>,_std::allocator<OpenMD::Vector<double,_2U>_>_>.
  _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_228.
  super__Vector_base<OpenMD::Vector<double,_2U>,_std::allocator<OpenMD::Vector<double,_2U>_>_>.
  _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  if (this->nZBins_ != 0) {
    uVar11 = 0;
    do {
      uVar12 = 0;
      if (this->nRBins_ == 0) {
        dVar22 = 0.5;
      }
      else {
        bVar15 = 0;
        uVar17 = 0;
        uVar16 = uVar12;
        uVar12 = 0;
        pvVar14 = local_1f8.
                  super__Vector_base<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
                  ._M_impl.super__Vector_impl_data._M_start;
        do {
          dVar22 = (pvVar14->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
                   super__Vector_impl_data._M_start[uVar11];
          if (this->threshDens_ <= dVar22) {
            bVar15 = 1;
          }
          if ((bool)(dVar22 <= this->threshDens_ & bVar15)) {
            uVar16 = uVar17 & 0xffffffff;
            uVar12 = 1;
            bVar15 = 0;
          }
          uVar17 = uVar17 + 1;
          pvVar14 = pvVar14 + 1;
        } while (this->nRBins_ != uVar17);
        dVar22 = (double)(int)uVar16 + 0.5;
      }
      if (uVar12 != 0) {
        local_128.d.data_.super__Vector_base<double,_std::allocator<double>_>._M_impl.
        super__Vector_impl_data._M_start =
             (pointer)(((double)uVar11 + 0.5) * (double)local_208 +
                      ((local_1b8 - this->solidZ_) - (double)local_1d8._0_8_));
        local_128._0_8_ = dVar22 * local_238;
        if (this->bufferLength_ <=
            (double)local_128.d.data_.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                    super__Vector_impl_data._M_start &&
            (double)local_128.d.data_.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                    super__Vector_impl_data._M_start != this->bufferLength_) {
          std::vector<OpenMD::Vector<double,_2U>,_std::allocator<OpenMD::Vector<double,_2U>_>_>::
          push_back(&local_228,(value_type *)&local_128);
        }
      }
      uVar11 = (ulong)((int)uVar11 + 1);
    } while (uVar11 < this->nZBins_);
  }
  local_158 = (local_228.
               super__Vector_base<OpenMD::Vector<double,_2U>,_std::allocator<OpenMD::Vector<double,_2U>_>_>
               ._M_impl.super__Vector_impl_data._M_start)->data_[0];
  dStack_150 = (local_228.
                super__Vector_base<OpenMD::Vector<double,_2U>,_std::allocator<OpenMD::Vector<double,_2U>_>_>
                ._M_impl.super__Vector_impl_data._M_start)->data_[1];
  uVar27 = (uint)((ulong)((long)local_228.
                                super__Vector_base<OpenMD::Vector<double,_2U>,_std::allocator<OpenMD::Vector<double,_2U>_>_>
                                ._M_impl.super__Vector_impl_data._M_finish -
                         (long)local_228.
                               super__Vector_base<OpenMD::Vector<double,_2U>,_std::allocator<OpenMD::Vector<double,_2U>_>_>
                               ._M_impl.super__Vector_impl_data._M_start) >> 4);
  if (1 < (int)uVar27) {
    lVar19 = (ulong)(uVar27 & 0x7fffffff) - 1;
    pVVar9 = local_228.
             super__Vector_base<OpenMD::Vector<double,_2U>,_std::allocator<OpenMD::Vector<double,_2U>_>_>
             ._M_impl.super__Vector_impl_data._M_start;
    do {
      local_158 = local_158 + pVVar9[1].data_[0];
      dStack_150 = dStack_150 + pVVar9[1].data_[1];
      lVar19 = lVar19 + -1;
      pVVar9 = pVVar9 + 1;
    } while (lVar19 != 0);
  }
  DynamicRectMatrix<double>::DynamicRectMatrix(&local_1c8,4,4);
  dVar22 = 1.0 / (double)(int)uVar27;
  uStack_a0 = 0;
  local_158 = local_158 * dVar22;
  dStack_150 = dStack_150 * dVar22;
  lVar19 = 0;
  do {
    pdVar3 = local_1c8.data_[lVar19];
    pdVar3[2] = 0.0;
    pdVar3[3] = 0.0;
    *pdVar3 = 0.0;
    pdVar3[1] = 0.0;
    lVar19 = lVar19 + 1;
  } while (lVar19 != 4);
  if (0 < (int)uVar27) {
    pdVar3 = *local_1c8.data_;
    pdVar4 = local_1c8.data_[1];
    pdVar5 = local_1c8.data_[2];
    pdVar6 = local_1c8.data_[3];
    uVar11 = (ulong)(uVar27 & 0x7fffffff);
    pVVar9 = local_228.
             super__Vector_base<OpenMD::Vector<double,_2U>,_std::allocator<OpenMD::Vector<double,_2U>_>_>
             ._M_impl.super__Vector_impl_data._M_start;
    do {
      dVar23 = pVVar9->data_[0];
      dVar32 = pVVar9->data_[1];
      pdVar3[1] = pdVar3[1] + dVar23;
      pdVar3[2] = pdVar3[2] + dVar32;
      dVar30 = dVar23 * dVar23 + dVar32 * dVar32;
      pdVar3[3] = dVar30 + pdVar3[3];
      pdVar4[1] = pdVar4[1] + dVar23 * dVar23;
      pdVar4[2] = pdVar4[2] + dVar23 * dVar32;
      pdVar4[3] = dVar23 * dVar30 + pdVar4[3];
      pdVar5[2] = dVar32 * dVar32 + pdVar5[2];
      pdVar5[3] = dVar32 * dVar30 + pdVar5[3];
      pdVar6[3] = dVar30 * dVar30 + pdVar6[3];
      pVVar9 = pVVar9 + 1;
      uVar11 = uVar11 - 1;
    } while (uVar11 != 0);
  }
  **local_1c8.data_ = (double)(int)uVar27;
  lVar19 = 0;
  do {
    if (lVar19 != 0) {
      pdVar3 = local_1c8.data_[lVar19];
      lVar13 = 0;
      do {
        pdVar3[lVar13] = local_1c8.data_[lVar13][lVar19];
        lVar13 = lVar13 + 1;
      } while (lVar19 != lVar13);
    }
    lVar19 = lVar19 + 1;
  } while (lVar19 != 4);
  lVar19 = 0;
  do {
    pdVar3 = local_1c8.data_[lVar19];
    lVar13 = 0;
    do {
      pdVar4 = pdVar3 + lVar13;
      dVar23 = pdVar4[1];
      pdVar5 = pdVar3 + lVar13;
      *pdVar5 = *pdVar4 * dVar22;
      pdVar5[1] = dVar23 * dVar22;
      lVar13 = lVar13 + 2;
    } while (lVar13 != 4);
    lVar19 = lVar19 + 1;
  } while (lVar19 != 4);
  local_a8 = dVar22;
  JAMA::Eigenvalue<double>::Eigenvalue(&local_128,&local_1c8);
  DynamicRectMatrix<double>::DynamicRectMatrix(&local_168,4,4);
  local_198.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
  _M_start = (pointer)0x0;
  local_198.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
  _M_finish = (pointer)0x0;
  local_198.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (pointer)0x0;
  local_198.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
  _M_start = (pointer)operator_new(0x20);
  local_198.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
  _M_finish = local_198.super__Vector_base<double,_std::allocator<double>_>._M_impl.
              super__Vector_impl_data._M_start + 4;
  local_198.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
  _M_start[2] = 0.0;
  local_198.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
  _M_start[3] = 0.0;
  *local_198.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
   _M_start = 0.0;
  local_198.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
  _M_start[1] = 0.0;
  local_198.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage =
       local_198.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data
       ._M_finish;
  std::vector<double,_std::allocator<double>_>::reserve
            (&local_198,
             (long)local_128.d.data_.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                   super__Vector_impl_data._M_finish -
             (long)local_128.d.data_.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                   super__Vector_impl_data._M_start >> 3);
  std::vector<double,_std::allocator<double>_>::operator=(&local_198,&local_128.d.data_);
  DynamicRectMatrix<double>::operator=((DynamicRectMatrix<double> *)&local_180,&local_168);
  DynamicRectMatrix<double>::deallocate((DynamicRectMatrix<double> *)&local_180);
  DynamicRectMatrix<double>::getColumn(&local_180,&local_168,0);
  pdVar3 = (double *)
           local_180.data_.super__Vector_base<double,_std::allocator<double>_>._M_impl.
           super__Vector_impl_data._M_start[3];
  lVar19 = 0;
  do {
    local_98[lVar19] =
         (double)local_180.data_.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                 super__Vector_impl_data._M_start[lVar19] * (1.0 / (double)pdVar3);
    lVar19 = lVar19 + 1;
  } while (lVar19 != 3);
  local_98[1] = local_98[1] * -0.5;
  local_98[2] = local_98[2] * -0.5;
  dVar23 = ABS((local_98[1] * local_98[1] + local_98[2] * local_98[2]) - local_98[0]);
  if (dVar23 < 0.0) {
    local_1b8 = local_98[1];
    dStack_1b0 = local_98[2];
    sqrt(dVar23);
    local_98[1] = local_1b8;
    local_98[2] = dStack_1b0;
  }
  iVar18 = 0;
  do {
    dVar32 = 0.0;
    uVar33 = 0;
    pdVar31 = (pointer)0x0;
    dVar23 = 0.0;
    RVar29 = local_98[1];
    dVar30 = local_98[2];
    if (0 < (int)uVar27) {
      uVar11 = 0;
      local_1b8 = local_98[1];
      dStack_1b0 = local_98[2];
      do {
        local_1a8[0] = local_228.
                       super__Vector_base<OpenMD::Vector<double,_2U>,_std::allocator<OpenMD::Vector<double,_2U>_>_>
                       ._M_impl.super__Vector_impl_data._M_start[uVar11].data_[0] - local_98[1];
        local_1a8[1] = local_228.
                       super__Vector_base<OpenMD::Vector<double,_2U>,_std::allocator<OpenMD::Vector<double,_2U>_>_>
                       ._M_impl.super__Vector_impl_data._M_start[uVar11].data_[1] - local_98[2];
        lVar19 = 0;
        dVar30 = 0.0;
        do {
          dVar30 = dVar30 + local_1a8[lVar19] * local_1a8[lVar19];
          lVar19 = lVar19 + 1;
        } while (lVar19 == 1);
        if (dVar30 < 0.0) {
          local_208 = pdVar31;
          dStack_200 = dVar23;
          local_1d8._0_8_ = dVar32;
          local_1d8._8_8_ = uVar33;
          dVar30 = sqrt(dVar30);
          pdVar31 = local_208;
          dVar23 = dStack_200;
          dVar32 = (double)local_1d8._0_8_;
          uVar33 = local_1d8._8_8_;
          local_98[1] = local_1b8;
          local_98[2] = dStack_1b0;
        }
        else {
          dVar30 = SQRT(dVar30);
        }
        if (1e-06 < dVar30) {
          pdVar31 = (pointer)((double)pdVar31 - (1.0 / dVar30) * local_1a8[0]);
          dVar23 = dVar23 - (1.0 / dVar30) * local_1a8[1];
          dVar32 = dVar32 + dVar30;
        }
        uVar11 = uVar11 + 1;
        RVar29 = local_98[1];
        dVar30 = local_98[2];
      } while (uVar11 != (uVar27 & 0x7fffffff));
    }
    dVar32 = dVar32 * local_a8;
    local_98[1] = dVar32 * (double)pdVar31 * dVar22 + local_158;
    local_98[2] = dVar32 * dVar23 * dVar22 + dStack_150;
  } while ((1e-06 < ABS(local_98[2] - dVar30) || 1e-06 < ABS(local_98[1] - RVar29)) &&
          (iVar18 = iVar18 + 1, iVar18 != 100));
  if (ABS(local_98[2]) <= dVar32) {
    dVar22 = asin(local_98[2] / dVar32);
    local_1a8[0] = dVar22 * 57.29577951308232 + 90.0;
  }
  else {
    local_1a8[0] = 180.0;
  }
  __position._M_current =
       (this->super_SequentialAnalyzer).values_.super__Vector_base<double,_std::allocator<double>_>.
       _M_impl.super__Vector_impl_data._M_finish;
  if (__position._M_current ==
      (this->super_SequentialAnalyzer).values_.super__Vector_base<double,_std::allocator<double>_>.
      _M_impl.super__Vector_impl_data._M_end_of_storage) {
    std::vector<double,std::allocator<double>>::_M_realloc_insert<double_const&>
              ((vector<double,std::allocator<double>> *)&(this->super_SequentialAnalyzer).values_,
               __position,local_1a8);
  }
  else {
    *__position._M_current = local_1a8[0];
    (this->super_SequentialAnalyzer).values_.super__Vector_base<double,_std::allocator<double>_>.
    _M_impl.super__Vector_impl_data._M_finish = __position._M_current + 1;
  }
  if ((double **)
      local_180.data_.super__Vector_base<double,_std::allocator<double>_>._M_impl.
      super__Vector_impl_data._M_start != (double **)0x0) {
    operator_delete(local_180.data_.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                    super__Vector_impl_data._M_start,
                    (long)local_180.data_.super__Vector_base<double,_std::allocator<double>_>.
                          _M_impl.super__Vector_impl_data._M_end_of_storage -
                    (long)local_180.data_.super__Vector_base<double,_std::allocator<double>_>.
                          _M_impl.super__Vector_impl_data._M_start);
  }
  if (local_198.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
      _M_start != (pointer)0x0) {
    operator_delete(local_198.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                    super__Vector_impl_data._M_start,
                    (long)local_198.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                          super__Vector_impl_data._M_end_of_storage -
                    (long)local_198.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                          super__Vector_impl_data._M_start);
  }
  DynamicRectMatrix<double>::deallocate(&local_168);
  if (local_128.ort.data_.super__Vector_base<double,_std::allocator<double>_>._M_impl.
      super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_128.ort.data_.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                    super__Vector_impl_data._M_start,
                    (long)local_128.ort.data_.super__Vector_base<double,_std::allocator<double>_>.
                          _M_impl.super__Vector_impl_data._M_end_of_storage -
                    (long)local_128.ort.data_.super__Vector_base<double,_std::allocator<double>_>.
                          _M_impl.super__Vector_impl_data._M_start);
  }
  DynamicRectMatrix<double>::deallocate(&local_128.H);
  DynamicRectMatrix<double>::deallocate(&local_128.V);
  if (local_128.e.data_.super__Vector_base<double,_std::allocator<double>_>._M_impl.
      super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_128.e.data_.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                    super__Vector_impl_data._M_start,
                    (long)local_128.e.data_.super__Vector_base<double,_std::allocator<double>_>.
                          _M_impl.super__Vector_impl_data._M_end_of_storage -
                    (long)local_128.e.data_.super__Vector_base<double,_std::allocator<double>_>.
                          _M_impl.super__Vector_impl_data._M_start);
  }
  if (local_128.d.data_.super__Vector_base<double,_std::allocator<double>_>._M_impl.
      super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_128.d.data_.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                    super__Vector_impl_data._M_start,
                    (long)local_128.d.data_.super__Vector_base<double,_std::allocator<double>_>.
                          _M_impl.super__Vector_impl_data._M_end_of_storage -
                    (long)local_128.d.data_.super__Vector_base<double,_std::allocator<double>_>.
                          _M_impl.super__Vector_impl_data._M_start);
  }
  DynamicRectMatrix<double>::deallocate(&local_1c8);
  if (local_228.
      super__Vector_base<OpenMD::Vector<double,_2U>,_std::allocator<OpenMD::Vector<double,_2U>_>_>.
      _M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_228.
                    super__Vector_base<OpenMD::Vector<double,_2U>,_std::allocator<OpenMD::Vector<double,_2U>_>_>
                    ._M_impl.super__Vector_impl_data._M_start,
                    (long)local_228.
                          super__Vector_base<OpenMD::Vector<double,_2U>,_std::allocator<OpenMD::Vector<double,_2U>_>_>
                          ._M_impl.super__Vector_impl_data._M_end_of_storage -
                    (long)local_228.
                          super__Vector_base<OpenMD::Vector<double,_2U>,_std::allocator<OpenMD::Vector<double,_2U>_>_>
                          ._M_impl.super__Vector_impl_data._M_start);
  }
  std::
  vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
  ::~vector(&local_1f8);
  return;
}

Assistant:

void ContactAngle2::doFrame(int) {
    StuntDouble* sd;
    int i;

    // set up the bins for density analysis

    Mat3x3d hmat = info_->getSnapshotManager()->getCurrentSnapshot()->getHmat();
    RealType len = std::min(hmat(0, 0), hmat(1, 1));
    RealType zLen = hmat(2, 2);

    RealType dr = len / (RealType)nRBins_;
    RealType dz = zLen / (RealType)nZBins_;

    std::vector<std::vector<RealType>> histo;
    histo.resize(nRBins_);
    for (unsigned int i = 0; i < histo.size(); ++i) {
      histo[i].resize(nZBins_);
      std::fill(histo[i].begin(), histo[i].end(), 0.0);
    }

    if (evaluator1_.isDynamic()) {
      seleMan1_.setSelectionSet(evaluator1_.evaluate());
    }

    Vector3d com(centroidX_, centroidY_, solidZ_);

    // now that we have the centroid, we can make cylindrical density maps
    Vector3d pos;
    RealType r;
    RealType z;

    for (sd = seleMan1_.beginSelected(i); sd != NULL;
         sd = seleMan1_.nextSelected(i)) {
      pos = sd->getPos() - com;

      // r goes from zero upwards
      r = sqrt(pow(pos.x(), 2) + pow(pos.y(), 2));
      // z is possibly symmetric around 0
      z = pos.z();

      int whichRBin = int(r / dr);
      int whichZBin = int((zLen / 2.0 + z) / dz);

      if ((whichRBin < int(nRBins_)) && (whichZBin >= 0) &&
          (whichZBin < int(nZBins_))) {
        histo[whichRBin][whichZBin] += sd->getMass();
      }
    }

    for (unsigned int i = 0; i < histo.size(); ++i) {
      RealType rL       = i * dr;
      RealType rU       = rL + dr;
      RealType volSlice = Constants::PI * dz * ((rU * rU) - (rL * rL));

      for (unsigned int j = 0; j < histo[i].size(); ++j) {
        histo[i][j] *= Constants::densityConvert / volSlice;
      }
    }

    std::vector<Vector<RealType, 2>> points;
    points.clear();

    for (unsigned int j = 0; j < nZBins_; ++j) {
      // The z coordinates were measured relative to the selection
      // center of mass.  However, we're interested in the elevation
      // above the solid surface.  Also, the binning was done around
      // zero with enough bins to cover the zLength of the box:

      RealType thez    = com.z() - solidZ_ - zLen / 2.0 + dz * (j + 0.5);
      bool aboveThresh = false;
      bool foundThresh = false;
      int rloc         = 0;

      for (std::size_t i = 0; i < nRBins_; ++i) {
        if (histo[i][j] >= threshDens_) aboveThresh = true;

        if (aboveThresh && (histo[i][j] <= threshDens_)) {
          rloc        = i;
          foundThresh = true;
          aboveThresh = false;
        }
      }
      if (foundThresh) {
        Vector<RealType, 2> point;
        point[0] = dr * (rloc + 0.5);
        point[1] = thez;

        if (thez > bufferLength_) { points.push_back(point); }
      }
    }

    int numPoints = points.size();

    // Compute the average of the data points.
    Vector<RealType, 2> average = points[0];
    int i0;
    for (i0 = 1; i0 < numPoints; ++i0) {
      average += points[i0];
    }
    RealType invNumPoints = ((RealType)1) / (RealType)numPoints;
    average *= invNumPoints;

    DynamicRectMatrix<RealType> mat(4, 4);
    int row, col;
    for (row = 0; row < 4; ++row) {
      for (col = 0; col < 4; ++col) {
        mat(row, col) = 0.0;
      }
    }
    for (int i = 0; i < numPoints; ++i) {
      RealType x   = points[i][0];
      RealType y   = points[i][1];
      RealType x2  = x * x;
      RealType y2  = y * y;
      RealType xy  = x * y;
      RealType r2  = x2 + y2;
      RealType xr2 = x * r2;
      RealType yr2 = y * r2;
      RealType r4  = r2 * r2;

      mat(0, 1) += x;
      mat(0, 2) += y;
      mat(0, 3) += r2;
      mat(1, 1) += x2;
      mat(1, 2) += xy;
      mat(1, 3) += xr2;
      mat(2, 2) += y2;
      mat(2, 3) += yr2;
      mat(3, 3) += r4;
    }
    mat(0, 0) = (RealType)numPoints;

    for (row = 0; row < 4; ++row) {
      for (col = 0; col < row; ++col) {
        mat(row, col) = mat(col, row);
      }
    }

    for (row = 0; row < 4; ++row) {
      for (col = 0; col < 4; ++col) {
        mat(row, col) *= invNumPoints;
      }
    }

    JAMA::Eigenvalue<RealType> eigensystem(mat);
    DynamicRectMatrix<RealType> evects(4, 4);
    DynamicVector<RealType> evals(4);

    eigensystem.getRealEigenvalues(evals);
    eigensystem.getV(evects);

    DynamicVector<RealType> evector = evects.getColumn(0);
    RealType inv = ((RealType)1) / evector[3];  // beware zero divide
    RealType coeff[3];
    for (row = 0; row < 3; ++row) {
      coeff[row] = inv * evector[row];
    }

    Vector<RealType, 2> center;

    center[0] = -((RealType)0.5) * coeff[1];
    center[1] = -((RealType)0.5) * coeff[2];
    RealType radius =
        sqrt(fabs(center[0] * center[0] + center[1] * center[1] - coeff[0]));

    int i1;
    for (i1 = 0; i1 < 100; ++i1) {
      // Update the iterates.
      Vector<RealType, 2> current = center;

      // Compute average L, dL/da, dL/db.
      RealType lenAverage               = (RealType)0;
      Vector<RealType, 2> derLenAverage = Vector<RealType, 2>(0.0);
      for (i0 = 0; i0 < numPoints; ++i0) {
        Vector<RealType, 2> diff = points[i0] - center;
        RealType length          = diff.length();
        if (length > 1e-6) {
          lenAverage += length;
          RealType invLength = ((RealType)1) / length;
          derLenAverage -= invLength * diff;
        }
      }
      lenAverage *= invNumPoints;
      derLenAverage *= invNumPoints;

      center = average + lenAverage * derLenAverage;
      radius = lenAverage;

      Vector<RealType, 2> diff = center - current;
      if (fabs(diff[0]) <= 1e-6 && fabs(diff[1]) <= 1e-6) { break; }
    }

    RealType zCen  = center[1];
    RealType rDrop = radius;
    RealType ca;

    if (fabs(zCen) > rDrop) {
      ca = 180.0;
    } else {
      ca = 90.0 + asin(zCen / rDrop) * (180.0 / Constants::PI);
    }

    values_.push_back(ca);
  }